

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_25::BinaryReader::CallbackMemLocation
          (BinaryReader *this,Address *alignment_log2,Index *memidx,Address *offset,
          uint8_t *lane_val)

{
  BinaryReaderDelegate *pBVar1;
  int iVar2;
  Enum EVar3;
  _func_int **pp_Var4;
  char *format;
  
  pBVar1 = this->delegate_;
  if (lane_val == (uint8_t *)0x0) {
    pp_Var4 = pBVar1->_vptr_BinaryReaderDelegate;
    if ((int)memidx != 0) goto LAB_00140567;
    iVar2 = (*pp_Var4[0x3c])(pBVar1,alignment_log2,(ulong)offset & 0xffffffff);
    if (iVar2 != 0) {
      format = "OnOpcodeUint32Uint32 callback failed";
      goto LAB_0014058d;
    }
LAB_0014059e:
    EVar3 = Ok;
  }
  else {
    pp_Var4 = pBVar1->_vptr_BinaryReaderDelegate;
    if ((int)memidx == 0) {
      memidx = (Index *)((ulong)offset & 0xffffffff);
      offset = (Address *)(ulong)*lane_val;
LAB_00140567:
      iVar2 = (*pp_Var4[0x3d])(pBVar1,alignment_log2,memidx,offset);
      if (iVar2 == 0) goto LAB_0014059e;
      format = "OnOpcodeUint32Uint32Uint32 callback failed";
    }
    else {
      iVar2 = (*pp_Var4[0x3e])();
      if (iVar2 == 0) goto LAB_0014059e;
      format = "OnOpcodeUint32Uint32Uint32Uint32 callback failed";
    }
LAB_0014058d:
    PrintError(this,format);
    EVar3 = Error;
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReader::CallbackMemLocation(const Address* alignment_log2,
                                         const Index* memidx,
                                         const Address* offset,
                                         const uint8_t* lane_val) {
  if (lane_val) {
    if (*memidx) {
      CALLBACK(OnOpcodeUint32Uint32Uint32Uint32, *alignment_log2, *memidx,
               *offset, *lane_val);
    } else {
      CALLBACK(OnOpcodeUint32Uint32Uint32, *alignment_log2, *offset, *lane_val);
    }
  } else {
    if (*memidx) {
      CALLBACK(OnOpcodeUint32Uint32Uint32, *alignment_log2, *memidx, *offset);
    } else {
      CALLBACK(OnOpcodeUint32Uint32, *alignment_log2, *offset);
    }
  }

  return Result::Ok;
}